

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamR.cpp
# Opt level: O1

void __thiscall OpenMD::TetrahedralityParamR::writeQr(TetrahedralityParamR *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  Revision rev;
  ofstream qRstream;
  Revision local_251;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"TetrahedralityParamR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection 1: (",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript1_)._M_dataplus._M_p,
                        (this->selectionScript1_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection 2: (",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript2_)._M_dataplus._M_p,
                        (this->selectionScript2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection 3: (",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript3_)._M_dataplus._M_p,
                        (this->selectionScript3_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#distance",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\tQk\n",4);
    if ((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        if ((this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3] != 0) {
          poVar2 = std::ostream::_M_insert<double>(((double)uVar3 + 0.5) * this->deltaR_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
          poVar2 = std::ostream::_M_insert<double>
                             ((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar3] /
                              (double)(this->sliceCount_).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        }
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < (ulong)((long)(this->sliceQ_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->sliceQ_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void TetrahedralityParamR::writeQr() {
    Revision rev;
    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "# OpenMD " << rev.getFullRevision() << "\n";
      qRstream << "# " << rev.getBuildDate() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tQk\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        if (sliceCount_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (RealType)sliceCount_[i]
                   << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TetrahedralityParamR: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }